

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.cpp
# Opt level: O3

hash_t duckdb::ChecksumRemainder(void *ptr,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = len * -0x395b586ca42e166b ^ 0xe17a1465;
  uVar1 = len >> 3;
  if (7 < len) {
    uVar3 = 0;
    do {
      uVar4 = *(long *)((long)ptr + uVar3 * 8) * -0x395b586ca42e166b;
      uVar2 = ((uVar4 >> 0x2f ^ uVar4) * -0x395b586ca42e166b ^ uVar2) * -0x395b586ca42e166b;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  switch((uint)len & 7) {
  case 7:
    uVar2 = uVar2 ^ (ulong)*(byte *)((long)ptr + uVar1 * 8 + 6) << 0x30;
  case 6:
    uVar2 = uVar2 ^ (ulong)*(byte *)((long)ptr + uVar1 * 8 + 5) << 0x28;
  case 5:
    uVar2 = uVar2 ^ (ulong)*(byte *)((long)ptr + uVar1 * 8 + 4) << 0x20;
  case 4:
    uVar2 = uVar2 ^ (ulong)*(byte *)((long)ptr + uVar1 * 8 + 3) << 0x18;
  case 3:
    uVar2 = uVar2 ^ (ulong)*(byte *)((long)ptr + uVar1 * 8 + 2) << 0x10;
  case 2:
    uVar2 = uVar2 ^ (ulong)*(byte *)((long)ptr + uVar1 * 8 + 1) << 8;
  case 1:
    uVar2 = (*(byte *)((long)ptr + uVar1 * 8) ^ uVar2) * -0x395b586ca42e166b;
  case 0:
    uVar1 = (uVar2 >> 0x2f ^ uVar2) * -0x395b586ca42e166b;
    return uVar1 >> 0x2f ^ uVar1;
  }
}

Assistant:

hash_t ChecksumRemainder(void *ptr, size_t len) noexcept {
	static constexpr uint64_t M = UINT64_C(0xc6a4a7935bd1e995);
	static constexpr uint64_t SEED = UINT64_C(0xe17a1465);
	static constexpr unsigned int R = 47;

	auto const *const data64 = static_cast<uint64_t const *>(ptr);
	uint64_t h = SEED ^ (len * M);

	size_t const n_blocks = len / 8;
	for (size_t i = 0; i < n_blocks; ++i) {
		auto k = Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(data64 + i));

		k *= M;
		k ^= k >> R;
		k *= M;

		h ^= k;
		h *= M;
	}

	auto const *const data8 = reinterpret_cast<uint8_t const *>(data64 + n_blocks);
	switch (len & 7U) {
	case 7:
		h ^= static_cast<uint64_t>(data8[6]) << 48U;
		DUCKDB_EXPLICIT_FALLTHROUGH;
	case 6:
		h ^= static_cast<uint64_t>(data8[5]) << 40U;
		DUCKDB_EXPLICIT_FALLTHROUGH;
	case 5:
		h ^= static_cast<uint64_t>(data8[4]) << 32U;
		DUCKDB_EXPLICIT_FALLTHROUGH;
	case 4:
		h ^= static_cast<uint64_t>(data8[3]) << 24U;
		DUCKDB_EXPLICIT_FALLTHROUGH;
	case 3:
		h ^= static_cast<uint64_t>(data8[2]) << 16U;
		DUCKDB_EXPLICIT_FALLTHROUGH;
	case 2:
		h ^= static_cast<uint64_t>(data8[1]) << 8U;
		DUCKDB_EXPLICIT_FALLTHROUGH;
	case 1:
		h ^= static_cast<uint64_t>(data8[0]);
		h *= M;
		DUCKDB_EXPLICIT_FALLTHROUGH;
	default:
		break;
	}
	h ^= h >> R;
	h *= M;
	h ^= h >> R;
	return static_cast<hash_t>(h);
}